

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

Wlc_Ntk_t * Wlc_ReadVer(char *pFileName)

{
  int iVar1;
  Wlc_Prs_t *p;
  Wlc_Ntk_t *pNew;
  
  p = Wlc_PrsStart(pFileName);
  if (p != (Wlc_Prs_t *)0x0) {
    iVar1 = Wlc_PrsPrepare(p);
    if ((iVar1 == 0) || (iVar1 = Wlc_PrsDerive(p), iVar1 == 0)) {
      pNew = (Wlc_Ntk_t *)0x0;
    }
    else {
      pNew = Wlc_NtkDupDfs(p->pNtk);
      Wlc_NtkTransferNames(pNew,p->pNtk);
    }
    if (p->sError[0] != '\0') {
      fputs(p->sError,_stdout);
    }
    Wlc_PrsStop(p);
    return pNew;
  }
  return (Wlc_Ntk_t *)0x0;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadVer( char * pFileName )
{
    Wlc_Prs_t * p;
    Wlc_Ntk_t * pNtk = NULL;
    // start the parser 
    p = Wlc_PrsStart( pFileName );
    if ( p == NULL )
        return NULL;
    // detect lines
    if ( !Wlc_PrsPrepare( p ) )
        goto finish;
    // parse models
    if ( !Wlc_PrsDerive( p ) )
        goto finish;
    // derive topological order
    pNtk = Wlc_NtkDupDfs( p->pNtk );
    Wlc_NtkTransferNames( pNtk, p->pNtk );
finish:
    Wlc_PrsPrintErrorMessage( p );
    Wlc_PrsStop( p );
    return pNtk;
}